

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrefixTree.h
# Opt level: O2

bool __thiscall
flow::util::
PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
::lookup(PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
         *this,Key *key,Value *value)

{
  Node *pNVar1;
  Value *pVVar2;
  const_iterator cVar3;
  size_type sVar4;
  char *ke;
  pointer __k;
  
  __k = (key->_M_dataplus)._M_p;
  sVar4 = key->_M_string_length;
  while ((sVar4 != 0 &&
         (cVar3 = std::
                  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<flow::util::PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<flow::util::PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->root_).children._M_h,__k),
         cVar3.
         super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<flow::util::PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>,_false>
         ._M_cur != (__node_type *)0x0))) {
    this = *(PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             **)((long)cVar3.
                       super__Node_iterator_base<std::pair<const_char,_std::unique_ptr<flow::util::PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node,_std::default_delete<flow::util::PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>::Node>_>_>,_false>
                       ._M_cur + 0x10);
    __k = __k + 1;
    sVar4 = sVar4 - 1;
  }
  while ((&this->root_ != (Node *)0x0 &&
         (pNVar1 = ((Node *)&(this->root_).parent)->parent, pNVar1 != (Node *)0x0))) {
    pVVar2 = &(this->root_).value;
    this = (PrefixTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
            *)pNVar1;
    if (*pVVar2 != 0) {
      *value = *pVVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool PrefixTree<K, V>::lookup(const Key& key, Value* value) const {
  const Node* level = &root_;

  for (const auto& ke : key) {
    auto i = level->children.find(ke);
    if (i == level->children.end())
      break;

    level = i->second.get();
  }

  while (level && level->parent) {
    if (level->value) {
      *value = level->value;
      return true;
    }
    level = level->parent;
  }

  return false;
}